

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O1

bool __thiscall
tinyusdz::crate::CrateReader::ReadListOp<tinyusdz::Payload>
          (CrateReader *this,ListOp<tinyusdz::Payload> *d)

{
  ulong uVar1;
  byte bVar2;
  StreamReader *pSVar3;
  bool bVar4;
  ostream *poVar5;
  ostringstream ss_e;
  long *local_1b8;
  long local_1a8 [2];
  vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> local_198 [4];
  ios_base local_128 [264];
  
  pSVar3 = this->_sr;
  uVar1 = pSVar3->idx_ + 1;
  if (pSVar3->length_ < uVar1) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"ReadListOp",10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_198,0x660);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"Failed to read ListOpHeader.",0x1c);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_1b8);
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8,local_1a8[0] + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    ::std::ios_base::~ios_base(local_128);
LAB_001d09d4:
    bVar4 = false;
  }
  else {
    bVar2 = pSVar3->binary_[pSVar3->idx_];
    pSVar3->idx_ = uVar1;
    if ((bVar2 & 1) != 0) {
      ListOp<tinyusdz::Payload>::ClearAndMakeExplicit(d);
    }
    if ((bVar2 & 2) != 0) {
      local_198[0].super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_198[0].super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      local_198[0].super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar4 = ReadArray<tinyusdz::Payload>(this,local_198);
      if (bVar4) {
        ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::operator=
                  (&d->explicit_items,local_198);
      }
      else {
        ::std::__cxx11::string::append((char *)&this->_err);
      }
      ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::~vector(local_198);
      if (!bVar4) goto LAB_001d09d4;
    }
    if ((bVar2 & 4) != 0) {
      local_198[0].super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_198[0].super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      local_198[0].super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar4 = ReadArray<tinyusdz::Payload>(this,local_198);
      if (bVar4) {
        ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::operator=
                  (&d->added_items,local_198);
      }
      else {
        ::std::__cxx11::string::append((char *)&this->_err);
      }
      ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::~vector(local_198);
      if (!bVar4) goto LAB_001d09d4;
    }
    if ((bVar2 & 0x20) != 0) {
      local_198[0].super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_198[0].super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      local_198[0].super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar4 = ReadArray<tinyusdz::Payload>(this,local_198);
      if (bVar4) {
        ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::operator=
                  (&d->prepended_items,local_198);
      }
      else {
        ::std::__cxx11::string::append((char *)&this->_err);
      }
      ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::~vector(local_198);
      if (!bVar4) goto LAB_001d09d4;
    }
    if ((bVar2 & 0x40) != 0) {
      local_198[0].super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_198[0].super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      local_198[0].super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar4 = ReadArray<tinyusdz::Payload>(this,local_198);
      if (bVar4) {
        ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::operator=
                  (&d->appended_items,local_198);
      }
      else {
        ::std::__cxx11::string::append((char *)&this->_err);
      }
      ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::~vector(local_198);
      if (!bVar4) goto LAB_001d09d4;
    }
    if ((bVar2 & 8) != 0) {
      local_198[0].super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_198[0].super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      local_198[0].super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar4 = ReadArray<tinyusdz::Payload>(this,local_198);
      if (bVar4) {
        ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::operator=
                  (&d->deleted_items,local_198);
      }
      else {
        ::std::__cxx11::string::append((char *)&this->_err);
      }
      ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::~vector(local_198);
      if (!bVar4) goto LAB_001d09d4;
    }
    if ((bVar2 & 0x10) != 0) {
      local_198[0].super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)0x0;
      local_198[0].super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)0x0;
      local_198[0].super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar4 = ReadArray<tinyusdz::Payload>(this,local_198);
      if (bVar4) {
        ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::operator=
                  (&d->ordered_items,local_198);
      }
      else {
        ::std::__cxx11::string::append((char *)&this->_err);
      }
      ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::~vector(local_198);
      if (!bVar4) goto LAB_001d09d4;
    }
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool CrateReader::ReadListOp(ListOp<T> *d) {
  // read ListOpHeader
  ListOpHeader h;
  if (!_sr->read1(&h.bits)) {
    PUSH_ERROR("Failed to read ListOpHeader.");
    return false;
  }

  if (h.IsExplicit()) {
    d->ClearAndMakeExplicit();
  }

  //
  // NOTE: array data is not compressed even for Int type
  //

  if (h.HasExplicitItems()) {
    std::vector<T> items;
    if (!ReadArray(&items)) {
      _err += "Failed to read ListOp::ExplicitItems.\n";
      return false;
    }

    d->SetExplicitItems(items);
  }

  if (h.HasAddedItems()) {
    std::vector<T> items;
    if (!ReadArray(&items)) {
      _err += "Failed to read ListOp::AddedItems.\n";
      return false;
    }

    d->SetAddedItems(items);
  }

  if (h.HasPrependedItems()) {
    std::vector<T> items;
    if (!ReadArray(&items)) {
      _err += "Failed to read ListOp::PrependedItems.\n";
      return false;
    }

    d->SetPrependedItems(items);
  }

  if (h.HasAppendedItems()) {
    std::vector<T> items;
    if (!ReadArray(&items)) {
      _err += "Failed to read ListOp::AppendedItems.\n";
      return false;
    }

    d->SetAppendedItems(items);
  }

  if (h.HasDeletedItems()) {
    std::vector<T> items;
    if (!ReadArray(&items)) {
      _err += "Failed to read ListOp::DeletedItems.\n";
      return false;
    }

    d->SetDeletedItems(items);
  }

  if (h.HasOrderedItems()) {
    std::vector<T> items;
    if (!ReadArray(&items)) {
      _err += "Failed to read ListOp::OrderedItems.\n";
      return false;
    }

    d->SetOrderedItems(items);
  }

  return true;
}